

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O2

void cos1D_display<IMLE<1,1,FastLinearExpert>>(IMLE<1,_1,_FastLinearExpert> *imleObj)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Input dimension: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Output dimension: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Number of experts: ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,imleObj->M);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Common Sigma: ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)&imleObj->Sigma);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Common Psi: ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)&imleObj->Psi);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t --- Internal Data: ---");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = operator<<((ostream *)&std::cout,imleObj);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void cos1D_display( Learner &imleObj)
{
    // Dimensions:
    cout << "Input dimension: "  << imleObj.inputDim() << endl;
    cout << "Output dimension: " << imleObj.outputDim() << endl;

    // Number of Experts
    cout << "\t --- Number of experts: ---" << endl;
    cout << imleObj.getNumberOfExperts() << endl;

    // Common Sigma
    cout << "\t --- Common Sigma: ---" << endl;
    cout << imleObj.getSigma() << endl;

    // Psi
    cout << "\t --- Common Psi: ---" << endl;
    cout << imleObj.getPsi() << endl;

    // Showing internal data
    cout << "\t --- Internal Data: ---" << endl;
    cout << imleObj << endl;
}